

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_o1.cc
# Opt level: O3

unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> __thiscall
lf::geometry::SegmentO1::SubGeometry(SegmentO1 *this,dim_t codim,dim_t i)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  double dVar3;
  _func_int **pp_Var4;
  runtime_error *this_00;
  uint in_ECX;
  _func_int *p_Var5;
  ActualDstType actualDst;
  undefined4 in_register_00000034;
  long lVar6;
  stringstream ss;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [392];
  
  if (i == 1) {
    if (1 < in_ECX) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a8 + 0x10),"i is out of bounds.",0x13);
      paVar1 = &local_208.field_2;
      local_208._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"i >= 0 && i < 2","");
      paVar2 = &local_1e8.field_2;
      local_1e8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o1.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed(&local_208,&local_1e8,0x27,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      local_208._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"false","");
      local_1e8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o1.cc"
                 ,"");
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
      base::AssertionFailed(&local_208,&local_1e8,0x27,&local_1c8);
      goto LAB_001d1bdb;
    }
    Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>::Block
              ((Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true> *)local_1a8,
               (Matrix<double,__1,_2,_0,__1,_2> *)(CONCAT44(in_register_00000034,codim) + 8),
               (ulong)in_ECX);
    pp_Var4 = (_func_int **)operator_new(0x18);
    local_208._M_dataplus._M_p = (pointer)0x0;
    local_208._M_string_length = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_208,
               local_1a8._8_8_,1);
    Eigen::internal::
    resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,2,0,_1,2>const,_1,1,true>,double,double>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_208,
               (Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true> *)local_1a8,
               (assign_op<double,_double> *)&local_1e8);
    p_Var5 = (_func_int *)
             (local_208._M_string_length - ((long)local_208._M_string_length >> 0x3f) &
             0xfffffffffffffffe);
    if (1 < (long)local_208._M_string_length) {
      lVar6 = 0;
      do {
        dVar3 = ((double *)(local_1a8._0_8_ + lVar6 * 8))[1];
        *(double *)(local_208._M_dataplus._M_p + lVar6 * 8) =
             *(double *)(local_1a8._0_8_ + lVar6 * 8);
        *(double *)((long)(local_208._M_dataplus._M_p + lVar6 * 8) + 8) = dVar3;
        lVar6 = lVar6 + 2;
      } while (lVar6 < (long)p_Var5);
    }
    if ((long)p_Var5 < (long)local_208._M_string_length) {
      do {
        *(double *)(local_208._M_dataplus._M_p + (long)p_Var5 * 8) =
             *(double *)(local_1a8._0_8_ + p_Var5 * 8);
        p_Var5 = p_Var5 + 1;
      } while ((_func_int *)local_208._M_string_length != p_Var5);
    }
    *pp_Var4 = (_func_int *)&PTR_DimLocal_00253b28;
    pp_Var4[1] = (_func_int *)local_208._M_dataplus._M_p;
    pp_Var4[2] = (_func_int *)local_208._M_string_length;
    (this->super_Geometry)._vptr_Geometry = pp_Var4;
  }
  else {
    if (i != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a8 + 0x10),"codim is out of bounds.",0x17);
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"false","");
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o1.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed(&local_208,&local_1e8,0x2a,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"this code should not be reached");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (in_ECX != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a8 + 0x10),"i is out of bounds.",0x13);
      paVar1 = &local_208.field_2;
      local_208._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"i == 0","");
      paVar2 = &local_1e8.field_2;
      local_1e8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o1.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed(&local_208,&local_1e8,0x23,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      local_208._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"false","");
      local_1e8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o1.cc"
                 ,"");
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
      base::AssertionFailed(&local_208,&local_1e8,0x23,&local_1c8);
LAB_001d1bdb:
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      abort();
    }
    pp_Var4 = (_func_int **)operator_new(0x18);
    Eigen::DenseStorage<double,_-1,_-1,_2,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_2,_0> *)local_1a8,
               (DenseStorage<double,__1,__1,_2,_0> *)(CONCAT44(in_register_00000034,codim) + 8));
    *pp_Var4 = (_func_int *)&PTR_DimLocal_00253cd0;
    pp_Var4[1] = (_func_int *)local_1a8._0_8_;
    pp_Var4[2] = (_func_int *)local_1a8._8_8_;
    (this->super_Geometry)._vptr_Geometry = pp_Var4;
  }
  return (__uniq_ptr_data<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>,_true,_true>
          )(__uniq_ptr_data<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Geometry> SegmentO1::SubGeometry(dim_t codim, dim_t i) const {
  if (codim == 0) {
    LF_ASSERT_MSG(i == 0, "i is out of bounds.");
    return std::make_unique<SegmentO1>(coords_);
  }
  if (codim == 1) {
    LF_ASSERT_MSG(i >= 0 && i < 2, "i is out of bounds.");
    return std::make_unique<Point>(coords_.col(i));
  }
  LF_VERIFY_MSG(false, "codim is out of bounds.");
}